

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

int Tim_ManPoNum(Tim_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  pVVar1 = p->vBoxes;
  if ((pVVar1 == (Vec_Ptr_t *)0x0) || (pVVar1->nSize == 0)) {
    iVar3 = p->nCos;
  }
  else {
    if (pVVar1 == (Vec_Ptr_t *)0x0) {
      iVar4 = -1;
    }
    else {
      iVar4 = pVVar1->nSize + -1;
    }
    iVar3 = p->nCos;
    iVar2 = Tim_ManBoxInputFirst(p,iVar4);
    iVar4 = Tim_ManBoxInputNum(p,iVar4);
    iVar3 = iVar3 - (iVar4 + iVar2);
  }
  return iVar3;
}

Assistant:

int Tim_ManPoNum( Tim_Man_t * p )
{
    int iLastBoxId;
    if ( Tim_ManBoxNum(p) == 0 )
        return Tim_ManCoNum(p);
    iLastBoxId = Tim_ManBoxNum(p) - 1;
    return Tim_ManCoNum(p) - (Tim_ManBoxInputFirst(p, iLastBoxId) + Tim_ManBoxInputNum(p, iLastBoxId));
}